

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void callStatGet(Parse *pParse,int regStat,int iParam,int regOut)

{
  int regOut_local;
  int iParam_local;
  int regStat_local;
  Parse *pParse_local;
  
  sqlite3VdbeAddFunctionCall(pParse,0,regStat,regOut,1,&statGetFuncdef,0);
  return;
}

Assistant:

static void callStatGet(Parse *pParse, int regStat, int iParam, int regOut){
#ifdef SQLITE_ENABLE_STAT4
  sqlite3VdbeAddOp2(pParse->pVdbe, OP_Integer, iParam, regStat+1);
#elif SQLITE_DEBUG
  assert( iParam==STAT_GET_STAT1 );
#else
  UNUSED_PARAMETER( iParam );
#endif
  assert( regOut!=regStat && regOut!=regStat+1 );
  sqlite3VdbeAddFunctionCall(pParse, 0, regStat, regOut, 1+IsStat4,
                             &statGetFuncdef, 0);
}